

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::binary_expression::print(binary_expression *this,wostream *os)

{
  wostream *pwVar1;
  syntax_node *psVar2;
  wostream *os_local;
  binary_expression *this_local;
  
  pwVar1 = std::operator<<(os,"binary_expression{");
  pwVar1 = mjs::operator<<(pwVar1,this->op_);
  pwVar1 = std::operator<<(pwVar1,", ");
  psVar2 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                      (&this->lhs_)->super_syntax_node;
  pwVar1 = mjs::operator<<(pwVar1,psVar2);
  pwVar1 = std::operator<<(pwVar1,", ");
  psVar2 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                      (&this->rhs_)->super_syntax_node;
  pwVar1 = mjs::operator<<(pwVar1,psVar2);
  std::operator<<(pwVar1,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "binary_expression{" << op_ << ", " << *lhs_ << ", " << *rhs_ << "}";
    }